

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTDMT_waitForAllJobsCompleted(ZSTDMT_CCtx *mtctx)

{
  uint uVar1;
  ZSTDMT_jobDescription *pZVar2;
  
  uVar1 = mtctx->doneJobID;
  if (uVar1 < mtctx->nextJobID) {
    do {
      uVar1 = uVar1 & mtctx->jobIDMask;
      pthread_mutex_lock((pthread_mutex_t *)&mtctx->jobs[uVar1].job_mutex);
      pZVar2 = mtctx->jobs;
      if (pZVar2[uVar1].consumed < pZVar2[uVar1].src.size) {
        do {
          pthread_cond_wait((pthread_cond_t *)&pZVar2[uVar1].job_cond,
                            (pthread_mutex_t *)&pZVar2[uVar1].job_mutex);
          pZVar2 = mtctx->jobs;
        } while (pZVar2[uVar1].consumed < pZVar2[uVar1].src.size);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&pZVar2[uVar1].job_mutex);
      uVar1 = mtctx->doneJobID + 1;
      mtctx->doneJobID = uVar1;
    } while (uVar1 < mtctx->nextJobID);
  }
  return;
}

Assistant:

static void ZSTDMT_waitForAllJobsCompleted(ZSTDMT_CCtx* mtctx)
{
    DEBUGLOG(4, "ZSTDMT_waitForAllJobsCompleted");
    while (mtctx->doneJobID < mtctx->nextJobID) {
        unsigned const jobID = mtctx->doneJobID & mtctx->jobIDMask;
        ZSTD_PTHREAD_MUTEX_LOCK(&mtctx->jobs[jobID].job_mutex);
        while (mtctx->jobs[jobID].consumed < mtctx->jobs[jobID].src.size) {
            DEBUGLOG(4, "waiting for jobCompleted signal from job %u", mtctx->doneJobID);   /* we want to block when waiting for data to flush */
            ZSTD_pthread_cond_wait(&mtctx->jobs[jobID].job_cond, &mtctx->jobs[jobID].job_mutex);
        }
        ZSTD_pthread_mutex_unlock(&mtctx->jobs[jobID].job_mutex);
        mtctx->doneJobID++;
    }
}